

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

EDLines * __thiscall EDLines::getLineImage(EDLines *this)

{
  long lVar1;
  int *in_RSI;
  long lVar2;
  long lVar3;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  undefined4 local_70 [2];
  EDLines *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58 = 0x406fe00000000000;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  cv::Mat::Mat((Mat *)this,in_RSI[1],*in_RSI,0,(Scalar_ *)&local_58);
  if (0 < in_RSI[0x9c]) {
    lVar3 = 0x18;
    lVar2 = 0;
    do {
      uStack_60 = 0;
      local_70[0] = 0x3010000;
      lVar1 = *(long *)(in_RSI + 0x96);
      local_78 = (int)ROUND(*(double *)(lVar1 + -0x18 + lVar3));
      local_74 = (int)ROUND(*(double *)(lVar1 + -0x10 + lVar3));
      local_80 = (int)ROUND(*(double *)(lVar1 + -8 + lVar3));
      local_7c = (int)ROUND(*(double *)(lVar1 + lVar3));
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = this;
      cv::line(local_70,&local_78,&local_80,&local_58,1,0x10,0);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar2 < in_RSI[0x9c]);
  }
  return this;
}

Assistant:

Mat EDLines::getLineImage()
{
	Mat lineImage = Mat(height, width, CV_8UC1, Scalar(255));
	for (int i = 0; i < linesNo; i++) {
		line(lineImage, linePoints[i].start, linePoints[i].end, Scalar(0), 1, LINE_AA, 0);
	}

	return lineImage;
}